

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

StringPtr kj::consumeLine(char **ptr)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  StringPtr SVar4;
  
  SVar4.content.ptr = skipSpace(*ptr);
  pcVar2 = SVar4.content.ptr;
  while( true ) {
    while( true ) {
      while( true ) {
        cVar1 = *pcVar2;
        if (cVar1 != '\n') break;
        pcVar3 = pcVar2 + 1;
        if ((pcVar2[1] != ' ') && (pcVar2[1] != '\t')) goto LAB_0030774c;
        *pcVar2 = ' ';
        pcVar2 = pcVar3;
      }
      if (cVar1 == '\r') break;
      if (cVar1 == '\0') {
        *ptr = pcVar2;
        goto LAB_00307752;
      }
      pcVar2 = pcVar2 + 1;
    }
    if (pcVar2[1] == '\n') {
      pcVar3 = pcVar2 + 2;
    }
    else {
      pcVar3 = pcVar2 + 1;
    }
    if ((pcVar2[(ulong)(pcVar2[1] == '\n') + 1] != ' ') &&
       (pcVar2[(ulong)(pcVar2[1] == '\n') + 1] != '\t')) break;
    *pcVar2 = ' ';
    pcVar3[-1] = ' ';
    pcVar2 = pcVar3;
  }
LAB_0030774c:
  *ptr = pcVar3;
  *pcVar2 = '\0';
LAB_00307752:
  SVar4.content.size_ = pcVar2 + (1 - (long)SVar4.content.ptr);
  return (StringPtr)SVar4.content;
}

Assistant:

static kj::StringPtr consumeLine(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\r': {
        char* end = p++;
        if (*p == '\n') ++p;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \r\n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          p[-1] = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n': {
        char* end = p++;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      default:
        ++p;
        break;
    }
  }
}